

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O1

exr_result_t
internal_decode_free_buffer
          (exr_decode_pipeline_t *decode,exr_transcoding_pipeline_buffer_id_t bufid,void **buf,
          size_t *sz)

{
  void *pvVar1;
  exr_const_context_t p_Var2;
  bool bVar3;
  exr_result_t eVar4;
  
  pvVar1 = *buf;
  if (pvVar1 != (void *)0x0) {
    if (*sz != 0) {
      if (decode->free_fn == (_func_void_exr_transcoding_pipeline_buffer_id_t_void_ptr *)0x0) {
        p_Var2 = decode->context;
        if (p_Var2 == (exr_const_context_t)0x0) {
          eVar4 = 2;
          bVar3 = false;
        }
        else if ((decode->part_index < 0) || (p_Var2->num_parts <= decode->part_index)) {
          bVar3 = false;
          eVar4 = (*p_Var2->print_error)(p_Var2,4,"Part index (%d) out of range");
        }
        else {
          eVar4 = (*p_Var2->free_fn)(pvVar1);
          bVar3 = true;
        }
        if (!bVar3) {
          return eVar4;
        }
      }
      else {
        (*decode->free_fn)(bufid,pvVar1);
      }
    }
    *buf = (void *)0x0;
  }
  *sz = 0;
  return 0;
}

Assistant:

exr_result_t
internal_decode_free_buffer (
    exr_decode_pipeline_t*               decode,
    exr_transcoding_pipeline_buffer_id_t bufid,
    void**                               buf,
    size_t*                              sz)
{
    void*  curbuf = *buf;
    size_t cursz  = *sz;
    if (curbuf)
    {
        if (cursz > 0)
        {
            if (decode->free_fn)
                decode->free_fn (bufid, curbuf);
            else
            {
                exr_const_context_t ctxt = decode->context;
                EXR_CHECK_CONTEXT_AND_PART (decode->part_index);

                ctxt->free_fn (curbuf);
            }
        }
        *buf = NULL;
    }
    *sz = 0;
    return EXR_ERR_SUCCESS;
}